

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_implemented_options(tcv_t *tcv,tcv_implemented_options_t *options)

{
  tcv_implemented_options_t *options_local;
  tcv_t *tcv_local;
  
  if (((tcv == (tcv_t *)0x0) || (options == (tcv_implemented_options_t *)0x0)) ||
     (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = -4;
  }
  else {
    options->bmp = '\0';
    options->bmp = options->bmp & 0xfe | *(byte *)((long)tcv->data + 0x41) & 1;
    options->bmp = options->bmp & 0xfd | (*(byte *)((long)tcv->data + 0x41) & 1) << 1;
    options->bmp = options->bmp & 0xfb | (*(byte *)((long)tcv->data + 0x41) & 1) << 2;
    options->bmp = options->bmp & 0xf7 | (*(byte *)((long)tcv->data + 0x42) & 1) << 3;
    options->bmp = options->bmp & 0xef | (*(byte *)((long)tcv->data + 0x42) & 1) << 4;
    options->bmp = options->bmp & 0xdf | (*(byte *)((long)tcv->data + 0x42) & 1) << 5;
    options->bmp = options->bmp & 0xbf | (*(byte *)((long)tcv->data + 0x42) & 1) << 6;
    options->bmp = options->bmp & 0x7f | *(char *)((long)tcv->data + 0x42) << 7;
    tcv_local._4_4_ = 0;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_implemented_options(tcv_t *tcv, tcv_implemented_options_t *options)
{
	if (tcv == NULL || options == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear options */
	options->bmp = 0;

	/* Information stored in BASIC_INFO_REG_OPTIONS */
	options->bits.cooled_laser_transmitted = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS];
	options->bits.power_lever_2 = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS];
	options->bits.linear_receiver_out = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS];

	/* Information stored in BASIC_INFO_REG_OPTIONS + 1 */
	options->bits.rate_select = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.tx_disable = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.tx_fault = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.signal_detect = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];
	options->bits.los = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_OPTIONS + 1];

	return 0;
}